

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  u8 *puVar4;
  char *pcVar5;
  bool bVar6;
  ushort uVar7;
  u16 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  u8 *pCell;
  ulong uVar13;
  u32 uVar14;
  uint uVar15;
  
  puVar4 = pPage->aData;
  pcVar5 = pPage->pBt->pPager->pTmpSpace;
  uVar9 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar3 = pPage->pBt->usableSize;
  uVar7 = *(ushort *)(puVar4 + uVar9 + 5) << 8 | *(ushort *)(puVar4 + uVar9 + 5) >> 8;
  memcpy(pcVar5 + uVar7,puVar4 + uVar7,(long)(int)(uVar3 - uVar7));
  uVar11 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar14 = uVar3;
  if (uVar2 != 0) {
    uVar13 = 0;
    do {
      uVar7 = *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) << 8 |
              *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) >> 8;
      if ((uVar7 < uVar11) ||
         (uVar15 = (uint)uVar7, uVar15 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar7)) {
        uVar10 = 0xc5fa;
LAB_00144efe:
        bVar6 = false;
        sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar10,
                    "118a3b35693b134d56ebd780123b7fd6f1497668");
      }
      else {
        pCell = (u8 *)(pcVar5 + uVar15);
        uVar8 = cellSizePtr(pPage,pCell);
        uVar14 = uVar14 - uVar8;
        if (((int)uVar14 < (int)uVar11) || ((int)uVar3 < (int)(uVar15 + uVar8))) {
          uVar10 = 0xc606;
          goto LAB_00144efe;
        }
        memcpy(puVar4 + uVar14,pCell,(ulong)uVar8);
        *(ushort *)(puVar4 + uVar13 * 2 + (ulong)uVar1) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
        bVar6 = true;
      }
      if (!bVar6) {
        return 0xb;
      }
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
  }
  *(ushort *)(puVar4 + uVar9 + 5) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
  (puVar4 + uVar9 + 1)[0] = '\0';
  (puVar4 + uVar9 + 1)[1] = '\0';
  puVar4[uVar9 + 7] = '\0';
  iVar12 = 0;
  memset(puVar4 + uVar11,0,(long)(int)(uVar14 - uVar11));
  if (uVar14 - uVar11 != (uint)pPage->nFree) {
    iVar12 = 0xb;
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xc617,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  return iVar12;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of a i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = get2byte(&data[hdr+5]);
  memcpy(&temp[cbrk], &data[cbrk], usableSize - cbrk);
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &temp[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    memcpy(&data[cbrk], &temp[pc], size);
    put2byte(pAddr, cbrk);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}